

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::npf::lookupInterpolatedG1(npf *this,int n,float_t theta)

{
  pointer pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pvVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  
  fVar6 = (theta / 3.1415927) * 0.5 * 90.0;
  fVar7 = 0.0;
  if (0.0 <= fVar6) {
    fVar7 = fVar6;
  }
  fVar6 = 89.0;
  if (fVar7 <= 89.0) {
    fVar6 = fVar7;
  }
  lVar5 = (long)(int)(fVar6 + 2.0 + 90.0) + (long)this->m_id * 0x200;
  pvVar4 = (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = pvVar4 + lVar5;
  uVar2 = pvVar1->x;
  uVar3 = pvVar1->y;
  vVar8.y = (float_t)uVar3;
  vVar8.x = (float_t)uVar2;
  vVar8.z = pvVar4[lVar5].z;
  return vVar8;
}

Assistant:

vec3 npf::lookupInterpolatedG1(int n, float_t theta) const
{
	float fb = theta / M_PI / 2 * 90.f;
	return uberTextureLookupInt(clamp(fb, 0.f, 89.f)+2+90);
	// find bin centers
	float f0 = floor(fb-0.5f) + 0.5f;
	float f1 = f0 + 1.f;
	// find bin indexes t0 and t1
	float t0 = floor(f0);
	float t1 = floor(f1);
	// ignores the first bin
	t0 = max(1.f, t0);
	t1 = max(2.f, t1);
	// find theta at bin centers
	//float theta0 = (t0+0.5f) * M_PI / 2 / 90.f;
	//float theta1 = (t1+0.5f) * M_PI / 2 / 90.f;
	//find the weights
	float w0 = 1.f - (fb - f0) ;
	float w1 = 1.f - w0 ; // 1.0 - (f1 - fb)
	// sample
	vec3 G1 = vec3(0);
	vec2 uv;
	uv.y = float(n)/256.f;
	if (t1 > 90.f-1.f) {
		uv.x = (t0+2.+90.f)/512.f;
		//G1 = uberTextureLookup(uv) * w0;
		G1 = uberTextureLookupInt(t0+2+90) * w0;
	} else {
		uv.x = (t0+2.+90.)/512.f;
		vec3 g0 = uberTextureLookup(uv);
		g0 = uberTextureLookupInt(t0+2+90);
		uv.x = (t1+2.+90.)/512.f;
		vec3 g1 = uberTextureLookup(uv);
		g1 = uberTextureLookupInt(t1+2+90);
		G1 = g0 * w0 + g1 * w1;
	}
	return G1;
}